

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Type __thiscall wasm::TranslateToFuzzReader::getTupleType(TranslateToFuzzReader *this)

{
  char cVar1;
  uint32_t uVar2;
  ulong uVar3;
  bool bVar4;
  Type local_50;
  undefined1 auStack_48 [8];
  vector<wasm::Type,_std::allocator<wasm::Type>_> elements;
  Type type;
  
  auStack_48 = (undefined1  [8])0x0;
  elements.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  elements.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = Random::upTo(&this->random,(this->fuzzParams->super_FuzzParams).MAX_TUPLE_SIZE - 1);
  uVar3 = (ulong)(uVar2 + 2);
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    elements.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)getSingleConcreteType(this);
    cVar1 = wasm::Type::isDefaultable();
    if (cVar1 != '\0') {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::push_back
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,
                 (value_type *)
                 &elements.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
  }
  while ((ulong)((long)elements.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                       super__Vector_impl_data._M_start - (long)auStack_48) < 9) {
    elements.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)getMVPType(this);
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48,
               (Type *)&elements.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
  }
  wasm::Type::Type(&local_50,auStack_48);
  std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
            ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_48);
  return (Type)local_50.id;
}

Assistant:

Type TranslateToFuzzReader::getTupleType() {
  std::vector<Type> elements;
  size_t maxElements = 2 + upTo(fuzzParams->MAX_TUPLE_SIZE - 1);
  for (size_t i = 0; i < maxElements; ++i) {
    auto type = getSingleConcreteType();
    // Don't add a non-defaultable type into a tuple, as currently we can't
    // spill them into locals (that would require a "let").
    if (type.isDefaultable()) {
      elements.push_back(type);
    }
  }
  while (elements.size() < 2) {
    elements.push_back(getMVPType());
  }
  return Type(elements);
}